

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

Am_ID_Tag Am_Get_Unique_ID_Tag(char *param_1,Am_ID_Tag in_class)

{
  if ((in_class & 0xfff) == 0) {
    in_class = Am_Get_Unique_ID_Tag::current_tag | in_class;
    Am_Get_Unique_ID_Tag::current_tag = Am_Get_Unique_ID_Tag::current_tag + 1;
  }
  if (499 < Am_Get_Unique_ID_Tag::current_tag) {
    return in_class;
  }
  Am_Error("*** Am_Get_Unique_ID_Tag: overflow!  Too many tags!");
}

Assistant:

Am_ID_Tag
Am_Get_Unique_ID_Tag(const char * /*type_name*/, Am_ID_Tag in_class)
#endif
{
#define _FIRST_TAG 500
  static Am_ID_Tag current_tag = _FIRST_TAG;
  Am_ID_Tag tag = current_tag | in_class;
  if (Am_Type_Base(in_class))
    tag = in_class;
  else
    current_tag++;
  if (current_tag < _FIRST_TAG) // this should never happen.
    Am_Error("*** Am_Get_Unique_ID_Tag: overflow!  Too many tags!");
#ifdef DEBUG
  if (type_name)
    Am_Register_Type_Name(tag, type_name);
#endif
  return tag;
}